

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O0

void tcmalloc::CentralCacheLockAll(void)

{
  uint uVar1;
  SpinLock *pSVar2;
  CentralFreeList *pCVar3;
  uint local_c;
  int i;
  
  pSVar2 = Static::pageheap_lock();
  SpinLock::Lock(pSVar2);
  local_c = 0;
  while( true ) {
    uVar1 = Static::num_size_classes();
    if (uVar1 <= local_c) break;
    pCVar3 = Static::central_cache();
    CentralFreeList::Lock(pCVar3 + (int)local_c);
    local_c = local_c + 1;
  }
  pSVar2 = ThreadCachePtr::GetSlowTLSLock();
  SpinLock::Lock(pSVar2);
  pSVar2 = GetSysAllocLock();
  SpinLock::Lock(pSVar2);
  return;
}

Assistant:

void CentralCacheLockAll() NO_THREAD_SAFETY_ANALYSIS
{
  Static::pageheap_lock()->Lock();
  for (int i = 0; i < Static::num_size_classes(); ++i)
    Static::central_cache()[i].Lock();
  ThreadCachePtr::GetSlowTLSLock()->Lock();
  GetSysAllocLock()->Lock();
}